

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readxm.c
# Opt level: O0

void * safe_realloc(void *ptr,size_t size)

{
  size_t in_RSI;
  void *in_RDI;
  void *new_block;
  undefined8 local_8;
  
  if (in_RDI == (void *)0x0) {
    local_8 = malloc(in_RSI);
  }
  else if (in_RSI == 0) {
    free(in_RDI);
    local_8 = (void *)0x0;
  }
  else {
    local_8 = realloc(in_RDI,in_RSI);
    if (local_8 == (void *)0x0) {
      free(in_RDI);
    }
  }
  return local_8;
}

Assistant:

static void *safe_realloc(void *ptr, size_t size)
{
	if (ptr == NULL)
		return malloc(size);

	if (size == 0) {
		free(ptr);
		return NULL;
	} else {
		void *new_block = realloc(ptr, size);
		if (!new_block)
			free(ptr);
		return new_block;
	}
}